

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O2

void __thiscall BronKerbosch::printReads(BronKerbosch *this,ostream *os,alignment_set_t *set)

{
  size_type pos;
  ostream *poVar1;
  string local_50;
  
  pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first(set);
  AlignmentRecord::getName_abi_cxx11_
            (&local_50,
             (this->alignments_).
             super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
             super__Vector_impl_data._M_start[pos]);
  std::operator<<(os,(string *)&local_50);
  while( true ) {
    std::__cxx11::string::~string((string *)&local_50);
    pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next(set,pos);
    if (pos == 0xffffffffffffffff) break;
    poVar1 = std::operator<<(os,",");
    AlignmentRecord::getName_abi_cxx11_
              (&local_50,
               (this->alignments_).
               super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
               super__Vector_impl_data._M_start[pos]);
    std::operator<<(poVar1,(string *)&local_50);
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void BronKerbosch::printReads(std::ostream& os, alignment_set_t set) {
    auto j = set.find_first();
    os << alignments_[j]->getName();

    for (j = set.find_next(j); j != alignment_set_t::npos; j = set.find_next(j)) {
        os << "," << alignments_[j]->getName();
    }
    os << endl;
}